

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# two-masters.cpp
# Opt level: O2

void TestSerializationImpl<std::vector<float,std::allocator<float>>>
               (vector<float,_std::allocator<float>_> *obj)

{
  int gid__;
  SaveBlock save;
  LoadBlock load_;
  _Manager_type p_Var1;
  Link *l;
  _Invoker_type in_stack_ffffffffffffe808;
  BlockID neighbor;
  communicator local_17e8;
  communicator comm;
  _Any_data local_17b8;
  code *local_17a8;
  code *local_17a0;
  Block<std::vector<float,_std::allocator<float>_>_> block;
  RoundRobinAssigner assigner;
  vector<int,_std::allocator<int>_> gids;
  _Any_data local_1738;
  undefined8 local_1728;
  undefined8 uStack_1720;
  _Any_data local_1718;
  undefined8 local_1708;
  undefined8 uStack_1700;
  _Any_data local_16f8;
  undefined8 local_16e8;
  undefined8 uStack_16e0;
  _Any_data local_16d8;
  undefined8 local_16c8;
  undefined8 uStack_16c0;
  _Any_data local_16b8;
  code *local_16a8;
  code *local_16a0;
  undefined8 local_1698;
  undefined8 uStack_1690;
  code *local_1688;
  code *local_1680;
  undefined8 local_1678;
  undefined8 uStack_1670;
  code *local_1668;
  code *local_1660;
  Master master;
  
  diy::mpi::communicator::communicator(&comm);
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  block.received.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  block.send.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_17e8.size_ = comm.size_;
  local_17e8.rank_ = comm.rank_;
  local_17e8.comm_.data = comm.comm_.data;
  local_17e8.owner_ = false;
  local_16d8._M_unused._M_object = (void *)0x0;
  local_16d8._8_8_ = 0;
  local_16c8 = 0;
  uStack_16c0 = 0;
  local_16f8._M_unused._M_object = (void *)0x0;
  local_16f8._8_8_ = 0;
  local_16e8 = 0;
  uStack_16e0 = 0;
  local_1718._M_unused._M_object = (void *)0x0;
  local_1718._8_8_ = 0;
  local_1708 = 0;
  uStack_1700 = 0;
  local_1728 = 0;
  uStack_1720 = 0;
  local_1738._M_unused._M_object = (void *)0x0;
  local_1738._8_8_ = 0;
  p_Var1 = (_Manager_type)operator_new(0x10);
  *(undefined ***)p_Var1 = &PTR_unload_incoming_00141740;
  *(undefined8 *)(p_Var1 + 8) = 0x1000;
  save.super__Function_base._M_functor._8_8_ = &local_1738;
  save.super__Function_base._M_functor._M_unused._M_object = &local_1718;
  save.super__Function_base._M_manager = p_Var1;
  save._M_invoker = in_stack_ffffffffffffe808;
  load_.super__Function_base._M_functor._4_4_ = neighbor.proc;
  load_.super__Function_base._M_functor._0_4_ = neighbor.gid;
  load_.super__Function_base._M_functor._8_8_ = local_17e8.comm_.data;
  load_.super__Function_base._M_manager = (_Manager_type)local_17e8._8_8_;
  load_._M_invoker._0_1_ = local_17e8.owner_;
  load_._M_invoker._1_7_ = local_17e8._17_7_;
  diy::Master::Master(&master,&local_17e8,1,-1,(CreateBlock *)&local_16d8,
                      (DestroyBlock *)&local_16f8,(ExternalStorage *)0x0,save,load_,
                      (QueuePolicy *)comm.comm_.data);
  std::_Function_base::~_Function_base((_Function_base *)&local_1738);
  std::_Function_base::~_Function_base((_Function_base *)&local_1718);
  std::_Function_base::~_Function_base((_Function_base *)&local_16f8);
  std::_Function_base::~_Function_base((_Function_base *)&local_16d8);
  diy::mpi::communicator::~communicator(&local_17e8);
  assigner.super_StaticAssigner.super_Assigner.size_ = comm.size_;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = comm.size_;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_001418c0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  diy::RoundRobinAssigner::local_gids(&assigner,comm.rank_,&gids);
  gid__ = *gids.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  l = (Link *)operator_new(0x20);
  (l->super_Factory<diy::Link>)._vptr_Factory = (_func_int **)&PTR_id_abi_cxx11__00141440;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (l->neighbors_).super__Vector_base<diy::BlockID,_std::allocator<diy::BlockID>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  neighbor.gid = 0;
  if (gid__ < comm.size_ + -1) {
    neighbor.gid = gid__ + 1;
  }
  neighbor.proc = neighbor.gid % assigner.super_StaticAssigner.super_Assigner.size_;
  std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back(&l->neighbors_,&neighbor);
  neighbor.gid = comm.size_ + -1;
  if (0 < gid__) {
    neighbor.gid = gid__ + -1;
  }
  neighbor.proc = neighbor.gid % assigner.super_StaticAssigner.super_Assigner.size_;
  std::vector<diy::BlockID,_std::allocator<diy::BlockID>_>::push_back(&l->neighbors_,&neighbor);
  std::vector<float,_std::allocator<float>_>::operator=(&block.send,obj);
  diy::Master::add(&master,gid__,&block,l);
  local_17b8._M_unused._M_object = (void *)0x0;
  local_17b8._8_8_ = 0;
  local_17a0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17a8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_1_>
            (&master,(anon_class_1_0_00000001 *)&stack0xffffffffffffe80f,(Skip *)&local_17b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_17b8);
  local_16b8._M_unused._M_object = (void *)0x0;
  local_16b8._8_8_ = 0;
  local_16a0 = std::
               _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
               ::_M_invoke;
  local_16a8 = std::
               _Function_handler<char_*(int,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:47:35)>
               ::_M_manager;
  local_1698 = 0;
  uStack_1690 = 0;
  local_1680 = std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_invoke;
  local_1688 = std::
               _Function_handler<void_(const_char_*),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:48:35)>
               ::_M_manager;
  local_1678 = 0;
  uStack_1670 = 0;
  local_1660 = std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_invoke;
  local_1668 = std::
               _Function_handler<void_(char_*,_const_char_*,_unsigned_long),_diy::MemoryManagement::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/diatomic[P]diy/include/diy/master.hpp:49:35)>
               ::_M_manager;
  diy::Master::exchange(&master,false,(MemoryManagement *)&local_16b8);
  diy::MemoryManagement::~MemoryManagement((MemoryManagement *)&local_16b8);
  local_17b8._M_unused._M_object = (void *)0x0;
  local_17b8._8_8_ = 0;
  local_17a0 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_invoke;
  local_17a8 = std::_Function_handler<bool_(int,_const_diy::Master_&),_diy::Master::NeverSkip>::
               _M_manager;
  diy::Master::
  foreach<TestSerializationImpl<std::vector<float,std::allocator<float>>>(std::vector<float,std::allocator<float>>const&)::_lambda(Block<std::vector<float,std::allocator<float>>>*,diy::Master::ProxyWithLink_const&)_2_>
            (&master,(anon_class_1_0_00000001 *)&stack0xffffffffffffe80f,(Skip *)&local_17b8);
  std::_Function_base::~_Function_base((_Function_base *)&local_17b8);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&gids.super__Vector_base<int,_std::allocator<int>_>);
  diy::Master::~Master(&master);
  TestEqual<float>(&block.send,&block.received);
  Block<std::vector<float,_std::allocator<float>_>_>::~Block(&block);
  diy::mpi::communicator::~communicator(&comm);
  return;
}

Assistant:

void TestSerializationImpl(const T& obj)
{
  diy::mpi::communicator comm;
  Block<T> block;

  {
  diy::Master master(comm);

  auto nblocks = comm.size();
  diy::RoundRobinAssigner assigner(comm.size(), nblocks);

  std::vector<int> gids;
  assigner.local_gids(comm.rank(), gids);
  assert(gids.size() == 1);
  auto gid = gids[0];

  diy::Link* link = new diy::Link;
  diy::BlockID neighbor;

  // send neighbor
  neighbor.gid = (gid < (nblocks - 1)) ? (gid + 1) : 0;
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  // recv neighbor
  neighbor.gid = (gid > 0) ? (gid - 1) : (nblocks - 1);
  neighbor.proc = assigner.rank(neighbor.gid);
  link->add_neighbor(neighbor);

  block.send = obj;
  master.add(gid, &block, link);

  // compute, exchange, compute
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.enqueue(cp.link()->target(0), b->send);
  });
  master.exchange();
  master.foreach([](Block<T> *b, const diy::Master::ProxyWithLink& cp) {
    cp.dequeue(cp.link()->target(1).gid, b->received);
  });

  //comm.barrier();
  }

  TestEqual(block.send, block.received);
}